

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomChar::read(DomChar *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QStringView tag;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  QLatin1String *in_stack_ffffffffffffff40;
  QLatin1String *a;
  uint in_stack_ffffffffffffff48;
  QLatin1String *pQVar5;
  DomChar *pDVar6;
  storage_type_conflict *in_stack_ffffffffffffff68;
  undefined1 local_58 [64];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  a = (QLatin1String *)CONCAT44(in_register_00000034,__fd);
  pDVar6 = this;
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1c223a);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001c23c4;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_18._0_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18 = QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s((char16_t *)a,(size_t)this);
      QStringView::QStringView<QString,_true>
                ((QStringView *)this,(QString *)CONCAT44(iVar2,in_stack_ffffffffffffff48));
      other.m_data = in_stack_ffffffffffffff68;
      other.m_size = (qsizetype)pDVar6;
      iVar3 = QStringView::compare
                        ((QStringView *)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),other,
                         CaseInsensitive);
      in_stack_ffffffffffffff48 = CONCAT13(iVar3 != 0,(int3)in_stack_ffffffffffffff48) ^ 0xff000000;
      QString::~QString((QString *)0x1c230c);
      if ((in_stack_ffffffffffffff48 & 0x1000000) == 0) {
        pQVar5 = a;
        QVar4 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)CONCAT44(iVar2,in_stack_ffffffffffffff48),(size_t)a);
        in_stack_ffffffffffffff68 = (storage_type_conflict *)QVar4.m_size;
        ::operator+(a,(QStringView *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        QXmlStreamReader::raiseError((QString *)a);
        QString::~QString((QString *)0x1c23b9);
        in_stack_ffffffffffffff40 = a;
        a = pQVar5;
      }
      else {
        QXmlStreamReader::readElementText(local_58,a,0);
        iVar2 = QString::toInt((QString *)CONCAT44(iVar2,in_stack_ffffffffffffff48),
                               (bool *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        setElementUnicode(this,iVar2);
        QString::~QString((QString *)0x1c2350);
      }
    }
  } while (iVar2 != 5);
LAB_001c23c4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomChar::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"unicode"_s, Qt::CaseInsensitive)) {
                setElementUnicode(reader.readElementText().toInt());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}